

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-doc.c
# Opt level: O3

fy_document * fy_parse_document_create(fy_parser *fyp,fy_eventp *fyep)

{
  undefined1 *puVar1;
  fy_document_state *pfVar2;
  void *pvVar3;
  fy_parse_cfg_flags fVar4;
  undefined4 uVar5;
  int iVar6;
  fy_document *fyd;
  fy_diag *pfVar7;
  fy_accel *pfVar8;
  fy_token *fyt;
  fy_parser *pfVar9;
  char *fmt;
  fy_diag_report_ctx local_48;
  
  if (fyep != (fy_eventp *)0x0 && fyp != (fy_parser *)0x0) {
    pfVar9 = fyp;
    if ((fyep->e).type == FYET_DOCUMENT_START) {
      fyd = (fy_document *)calloc(1,0x98);
      if (fyd == (fy_document *)0x0) {
        fmt = "malloc() failed";
        fyd = (fy_document *)0x0;
        iVar6 = 0x17e;
      }
      else {
        pfVar7 = fy_diag_ref(fyp->diag);
        fyd->diag = pfVar7;
        fVar4 = (fyp->cfg).flags;
        uVar5 = *(undefined4 *)&(fyp->cfg).field_0xc;
        pvVar3 = (fyp->cfg).userdata;
        pfVar7 = (fyp->cfg).diag;
        (fyd->parse_cfg).search_path = (fyp->cfg).search_path;
        (fyd->parse_cfg).flags = fVar4;
        *(undefined4 *)&(fyd->parse_cfg).field_0xc = uVar5;
        (fyd->parse_cfg).userdata = pvVar3;
        (fyd->parse_cfg).diag = pfVar7;
        (fyd->anchors)._lh.next = &(fyd->anchors)._lh;
        (fyd->anchors)._lh.prev = &(fyd->anchors)._lh;
        if ((int)(fyd->parse_cfg).flags < 0) {
LAB_0011c5b4:
          fyd->root = (fy_node *)0x0;
          pfVar2 = (fyep->e).field_1.document_start.document_state;
          (fyep->e).field_1.document_start.document_state = (fy_document_state *)0x0;
          fy_parse_eventp_recycle(fyp,fyep);
          fy_document_state_unref(fyd->fyds);
          fyd->fyds = pfVar2;
          (fyd->children)._lh.next = &(fyd->children)._lh;
          (fyd->children)._lh.prev = &(fyd->children)._lh;
          return fyd;
        }
        pfVar8 = (fy_accel *)malloc(0x28);
        fyd->axl = pfVar8;
        if (pfVar8 == (fy_accel *)0x0) {
          fmt = "malloc() failed";
          iVar6 = 0x189;
        }
        else {
          iVar6 = fy_accel_setup(pfVar8,&hd_anchor,fyd,8);
          if (iVar6 == 0) {
            pfVar8 = (fy_accel *)malloc(0x28);
            fyd->naxl = pfVar8;
            if (fyd->axl == (fy_accel *)0x0) {
              fmt = "malloc() failed";
              iVar6 = 0x192;
            }
            else {
              iVar6 = fy_accel_setup(pfVar8,&hd_nanchor,fyd,8);
              if (iVar6 == 0) goto LAB_0011c5b4;
              fmt = "fy_accel_setup() failed";
              iVar6 = 0x197;
            }
          }
          else {
            fmt = "fy_accel_setup() failed";
            iVar6 = 0x18e;
          }
        }
      }
      fy_parser_diag(fyp,4,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-doc.c"
                     ,iVar6,"fy_parse_document_create",fmt);
    }
    else {
      local_48.has_override = false;
      local_48._17_7_ = 0;
      local_48.override_file = (char *)0x0;
      local_48.override_line = 0;
      local_48.override_column = 0;
      local_48.type = FYET_ERROR;
      local_48.module = FYEM_DOC;
      fyt = fy_document_event_get_token(&fyep->e);
      local_48.fyt = fy_token_ref(fyt);
      fyd = (fy_document *)0x0;
      fy_parser_diag_report(fyp,&local_48,"invalid start of event stream");
    }
    fy_parse_document_destroy(pfVar9,fyd);
    fy_parse_eventp_recycle(fyp,fyep);
    puVar1 = &fyd->diag->field_0x3c;
    *puVar1 = *puVar1 & 0xfe;
  }
  return (fy_document *)0x0;
}

Assistant:

struct fy_document *fy_parse_document_create(struct fy_parser *fyp, struct fy_eventp *fyep) {
    struct fy_document *fyd = NULL;
    struct fy_document_state *fyds;
    struct fy_event *fye = NULL;
    int rc;

    if (!fyp || !fyep)
        return NULL;

    fye = &fyep->e;

    FYP_TOKEN_ERROR_CHECK(fyp, fy_document_event_get_token(fye), FYEM_DOC,
                          fye->type == FYET_DOCUMENT_START, err_out,
                          "invalid start of event stream");

    fyd = malloc(sizeof(*fyd));
    fyp_error_check(fyp, fyd, err_out,
                    "malloc() failed");

    memset(fyd, 0, sizeof(*fyd));

    fyd->diag = fy_diag_ref(fyp->diag);
    fyd->parse_cfg = fyp->cfg;

    fy_anchor_list_init(&fyd->anchors);
    if (fy_document_can_be_accelerated(fyd)) {
        fyd->axl = malloc(sizeof(*fyd->axl));
        fyp_error_check(fyp, fyd->axl, err_out,
                        "malloc() failed");

        /* start with a very small bucket list */
        rc = fy_accel_setup(fyd->axl, &hd_anchor, fyd, 8);
        fyp_error_check(fyp, !rc, err_out,
                        "fy_accel_setup() failed");

        fyd->naxl = malloc(sizeof(*fyd->naxl));
        fyp_error_check(fyp, fyd->axl, err_out,
                        "malloc() failed");

        /* start with a very small bucket list */
        rc = fy_accel_setup(fyd->naxl, &hd_nanchor, fyd, 8);
        fyp_error_check(fyp, !rc, err_out,
                        "fy_accel_setup() failed");
    }

    fyd->root = NULL;

    fyds = fye->document_start.document_state;
    fye->document_start.document_state = NULL;

    /* and we're done with this event */
    fy_parse_eventp_recycle(fyp, fyep);

    /* drop the old reference */
    fy_document_state_unref(fyd->fyds);

    /* note that we keep the reference */
    fyd->fyds = fyds;

    fy_document_list_init(&fyd->children);

    return fyd;

    err_out:
    fy_parse_document_destroy(fyp, fyd);
    fy_parse_eventp_recycle(fyp, fyep);
    fyd->diag->on_error = false;
    return NULL;
}